

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

void __thiscall
helics::CommonCore::removeTarget(CommonCore *this,InterfaceHandle handle,string_view targetToRemove)

{
  uchar uVar1;
  action_t newAction;
  _Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>,_true>
  *p_Var2;
  FederateState *this_00;
  InvalidIdentifier *this_01;
  string_view message;
  undefined1 local_d8 [16];
  undefined8 local_c8;
  undefined8 local_c0;
  Time TStack_b8;
  Time local_b0;
  Time TStack_a8;
  Time local_a0;
  byte abStack_98 [80];
  byte *local_48;
  undefined8 local_40;
  pointer pbStack_38;
  pointer local_30;
  pointer pbStack_28;
  
  p_Var2 = getHandleInfo(this,handle);
  if (p_Var2 == (_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>,_true>
                 *)0x0) {
    this_01 = (InvalidIdentifier *)__cxa_allocate_exception(0x28);
    message._M_str = "invalid handle";
    message._M_len = 0xe;
    InvalidIdentifier::InvalidIdentifier(this_01,message);
    __cxa_throw(this_01,&InvalidIdentifier::typeinfo,HelicsException::~HelicsException);
  }
  local_48 = local_d8 + 0x40;
  local_d8._0_4_ = cmd_ignore;
  local_d8._4_4_ = 0;
  local_c8._0_4_ = 0;
  local_c8._4_4_ = -1700000000;
  local_c0._0_2_ = 0;
  local_c0._2_2_ = 0;
  local_c0._4_4_ = 0;
  TStack_b8.internalTimeCode = 0;
  local_b0.internalTimeCode = 0;
  TStack_a8.internalTimeCode = 0;
  local_a0.internalTimeCode = 0;
  abStack_98[0] = 0;
  abStack_98[1] = 0;
  abStack_98[2] = 0;
  abStack_98[3] = 0;
  abStack_98[4] = 0;
  abStack_98[5] = 0;
  abStack_98[6] = 0;
  abStack_98[7] = 0;
  abStack_98[8] = 0;
  abStack_98[9] = 0;
  abStack_98[10] = 0;
  abStack_98[0xb] = 0;
  abStack_98[0xc] = 0;
  abStack_98[0xd] = 0;
  abStack_98[0xe] = 0;
  abStack_98[0xf] = 0;
  abStack_98[0x10] = 0;
  abStack_98[0x11] = 0;
  abStack_98[0x12] = 0;
  abStack_98[0x13] = 0;
  abStack_98[0x14] = 0;
  abStack_98[0x15] = 0;
  abStack_98[0x16] = 0;
  abStack_98[0x17] = 0;
  abStack_98[0x18] = 0;
  abStack_98[0x19] = 0;
  abStack_98[0x1a] = 0;
  abStack_98[0x1b] = 0;
  abStack_98[0x1c] = 0;
  abStack_98[0x1d] = 0;
  abStack_98[0x1e] = 0;
  abStack_98[0x1f] = 0;
  abStack_98[0x20] = 0;
  abStack_98[0x21] = 0;
  abStack_98[0x22] = 0;
  abStack_98[0x23] = 0;
  abStack_98[0x24] = 0;
  abStack_98[0x25] = 0;
  abStack_98[0x26] = 0;
  abStack_98[0x27] = 0;
  abStack_98[0x28] = 0;
  abStack_98[0x29] = 0;
  abStack_98[0x2a] = 0;
  abStack_98[0x2b] = 0;
  abStack_98[0x2c] = 0;
  abStack_98[0x2d] = 0;
  abStack_98[0x2e] = 0;
  abStack_98[0x2f] = 0;
  abStack_98[0x30] = 0;
  abStack_98[0x31] = 0;
  abStack_98[0x32] = 0;
  abStack_98[0x33] = 0;
  abStack_98[0x34] = 0;
  abStack_98[0x35] = 0;
  abStack_98[0x36] = 0;
  abStack_98[0x37] = 0;
  abStack_98[0x38] = 0;
  abStack_98[0x39] = 0;
  abStack_98[0x3a] = 0;
  abStack_98[0x3b] = 0;
  abStack_98[0x3c] = 0;
  abStack_98[0x3d] = 0;
  abStack_98[0x3e] = 0;
  abStack_98[0x3f] = 0;
  abStack_98[0x40] = 0;
  abStack_98[0x41] = 0;
  abStack_98[0x42] = 0;
  abStack_98[0x43] = 0;
  abStack_98[0x44] = 0;
  abStack_98[0x45] = 0;
  abStack_98[0x46] = 0;
  abStack_98[0x47] = 0;
  abStack_98[0x48] = 0x40;
  abStack_98[0x49] = 0;
  abStack_98[0x4a] = 0;
  abStack_98[0x4b] = 0;
  abStack_98[0x4c] = 0;
  abStack_98[0x4d] = 0;
  abStack_98[0x4e] = 0;
  abStack_98[0x4f] = 0;
  local_40._0_1_ = false;
  local_40._1_1_ = false;
  local_40._2_1_ = false;
  local_40._3_1_ = '\0';
  local_40._4_4_ = 0;
  pbStack_38 = (pointer)0x0;
  local_30 = (pointer)0x0;
  pbStack_28 = (pointer)0x0;
  local_d8._8_8_ = (p_Var2->super__Hash_node_base)._M_nxt;
  ActionMessage::name((ActionMessage *)local_d8,targetToRemove);
  this_00 = getFederateAt(this,(LocalFederateId)
                               *(BaseType *)
                                &(p_Var2->
                                 super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>,_true>
                                 ).
                                 super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>_>
                                 ._M_storage._M_storage);
  if (this_00 != (FederateState *)0x0) {
    TStack_b8.internalTimeCode = (this_00->time_granted).internalTimeCode;
  }
  uVar1 = (p_Var2->
          super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>,_true>
          ).
          super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>_>
          ._M_storage._M_storage.__data[4];
  if (uVar1 == 'e') {
    newAction = cmd_remove_named_filter;
LAB_00286ffd:
    ActionMessage::setAction((ActionMessage *)local_d8,newAction);
  }
  else {
    if (uVar1 == 'p') {
      newAction = cmd_remove_named_input;
      goto LAB_00286ffd;
    }
    if (uVar1 != 'i') {
      if (uVar1 != 'f') goto LAB_00287015;
      newAction = cmd_remove_named_endpoint;
      goto LAB_00286ffd;
    }
    ActionMessage::setAction((ActionMessage *)local_d8,cmd_remove_named_publication);
    FederateState::addAction(this_00,(ActionMessage *)local_d8);
  }
  BrokerBase::addActionMessage(&this->super_BrokerBase,(ActionMessage *)local_d8);
LAB_00287015:
  ActionMessage::~ActionMessage((ActionMessage *)local_d8);
  return;
}

Assistant:

void CommonCore::removeTarget(InterfaceHandle handle, std::string_view targetToRemove)
{
    const auto* handleInfo = getHandleInfo(handle);
    if (handleInfo == nullptr) {
        throw(InvalidIdentifier("invalid handle"));
    }

    ActionMessage cmd;
    cmd.setSource(handleInfo->handle);
    cmd.name(targetToRemove);
    auto* fed = getFederateAt(handleInfo->local_fed_id);
    if (fed != nullptr) {
        cmd.actionTime = fed->grantedTime();
    }
    switch (handleInfo->handleType) {
        case InterfaceType::PUBLICATION:
            cmd.setAction(CMD_REMOVE_NAMED_INPUT);
            break;
        case InterfaceType::FILTER:
            cmd.setAction(CMD_REMOVE_NAMED_ENDPOINT);
            break;
        case InterfaceType::INPUT:
            cmd.setAction(CMD_REMOVE_NAMED_PUBLICATION);
            fed->addAction(cmd);
            break;
        case InterfaceType::ENDPOINT:
            cmd.setAction(CMD_REMOVE_NAMED_FILTER);
            break;
        default:
            return;
    }
    addActionMessage(std::move(cmd));
}